

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O2

bool __thiscall CMU462::Timeline::unmarkTime(Timeline *this,int time)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  int local_1c;
  
  local_1c = time;
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->times)._M_t,&local_1c);
  p_Var2 = &(this->times)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node != p_Var2) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&(this->times)._M_t,&local_1c);
  }
  return (_Rb_tree_header *)iVar1._M_node != p_Var2;
}

Assistant:

bool Timeline::unmarkTime(int time) {
  if (times.find(time) != times.end()) {
    times.erase(time);
    return true;
  }

  return false;
}